

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  uint uVar1;
  long lVar2;
  float fVar3;
  uint32_t x_prev;
  int i_prev;
  
  _x_prev = (ulong)*X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0.0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    if (X[lVar2] != x_prev) {
      GetEntropyUnrefinedHelper(X[lVar2],(int)lVar2,&x_prev,&i_prev,bit_entropy,stats);
    }
  }
  GetEntropyUnrefinedHelper(0,(int)lVar2,&x_prev,&i_prev,bit_entropy,stats);
  uVar1 = bit_entropy->sum;
  if ((ulong)uVar1 < 0x100) {
    fVar3 = kSLog2Table[uVar1];
  }
  else {
    fVar3 = (*VP8LFastSLog2Slow)(uVar1);
  }
  bit_entropy->entropy = (double)fVar3 + bit_entropy->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(const uint32_t X[], int length,
                                  VP8LBitEntropy* const bit_entropy,
                                  VP8LStreaks* const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}